

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

bool __thiscall
tsbp::TwoStepBranchingProcedure::PlaceAtCurrentX
          (TwoStepBranchingProcedure *this,Node *node,Rectangle *item)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint uVar1;
  PackingRelaxed2D *packing;
  ulong *puVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  pointer local_40;
  size_t local_38;
  
  packing = (node->Packing)._M_t.
            super___uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>
            ._M_t.
            super__Tuple_impl<0UL,_tsbp::PackingRelaxed2D_*,_std::default_delete<tsbp::PackingRelaxed2D>_>
            .super__Head_base<0UL,_tsbp::PackingRelaxed2D_*,_false>._M_head_impl;
  bVar5 = IsPlacementFeasible(this,packing,item);
  if (bVar5) {
    (packing->ItemCoordinatesX).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[(node->super_BaseNode).ItemIdToPlace] = (int)packing->MinX;
    sVar7 = UpdatePlacedAreaAndDetermineLoss(this,packing,item);
    uVar1 = item->InternId;
    uVar9 = (ulong)(int)uVar1;
    if ((packing->PlaceableItemsAtCurrentX).m_num_bits < uVar9 + 1) {
      __assert_fail("pos + len <= m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                    ,0x7f3,
                    "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::range_operation(size_type, size_type, Block (*)(Block, size_type, size_type), Block (*)(Block)) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                   );
    }
    this_00 = &packing->PlaceableItemsAtCurrentX;
    if (uVar9 != 0xffffffffffffffff) {
      uVar10 = uVar1 & 0x3f;
      if (uVar1 < 0x40) {
        uVar9 = 0;
        if (uVar10 != 0x3f) {
          uVar9 = -2L << (sbyte)uVar10;
        }
        puVar2 = (this_00->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *puVar2 = *puVar2 & uVar9;
      }
      else {
        local_40 = (this_00->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        lVar8 = (uVar9 >> 6) - (ulong)(uVar10 != 0x3f);
        local_38 = sVar7;
        memset(local_40,0,(lVar8 + 1 + (ulong)(lVar8 == -1)) * 8);
        sVar7 = local_38;
        if (uVar10 != 0x3f) {
          local_40[uVar9 >> 6] = local_40[uVar9 >> 6] & -2L << (sbyte)uVar10;
        }
      }
    }
    if ((packing->PlacedAreaVector).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[packing->MinX] ==
        (long)(this->container).super_Rectangle.Dy) {
      packing->MinX = sVar7;
      packing->MinimumRemainingItemDyAtCurrentX = packing->MinimumRemainingItemDy;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (&local_68,&packing->PlacedItems);
      if (&local_68 != this_00) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                  (&this_00->m_bits,&local_68);
        puVar4 = local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar3 = local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (packing->PlaceableItemsAtCurrentX).m_num_bits = local_68.m_num_bits;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3,(long)puVar4 - (long)puVar3);
        }
        if (local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("(b.m_bits = buffer_type()).empty()",
                        "/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2e7,
                        "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator=(dynamic_bitset<Block, Allocator> &&) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        local_68.m_num_bits = 0;
      }
      bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_68);
      if (!bVar6) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if (local_68.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
                (this_00,(long)item->InternId);
    }
  }
  return bVar5;
}

Assistant:

bool TwoStepBranchingProcedure::PlaceAtCurrentX(Node& node, const Rectangle& item)
{
    PackingRelaxed2D& packing = *node.Packing;

    if (IsPlacementFeasible(packing, item))
    {
        packing.ItemCoordinatesX[node.ItemIdToPlace] = packing.MinX;

        size_t newCandidateX = UpdatePlacedAreaAndDetermineLoss(packing, item);
        ////size_t newX = UpdatePlacedAreaAndDetermineLossSS1(packing, item);

        packing.PlaceableItemsAtCurrentX.reset(0, (size_t)item.InternId + 1);

        if (packing.PlacedAreaVector[packing.MinX] == container.Dy)
        {
            packing.MinX = newCandidateX;

            // Must be reset because newX > packingMinX.
            // This lower bound can be raised by determining the remaining minY at newX at a cost of O(n) or by solving a subset sum problem in O(nC).
            packing.MinimumRemainingItemDyAtCurrentX = packing.MinimumRemainingItemDy;
            packing.PlaceableItemsAtCurrentX = ~packing.PlacedItems;
            packing.PlaceableItemsAtCurrentX.reset((size_t)item.InternId);
        }

        return true;
    }

    // Placement was infeasible.
    return false;
}